

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearLabelCase::iterate(ClearLabelCase *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  ClearLabelCase *pCVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  MessageBuilder *pMVar7;
  NotSupportedError *this_00;
  ostringstream *this_01;
  long lVar8;
  string *psVar9;
  ostringstream *poVar10;
  allocator<char> local_305;
  int outlen;
  ClearLabelCase *local_300;
  code *local_2f8;
  int local_2f0;
  undefined4 local_2e4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  long local_2c0;
  ScopedLogSection section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string local_270;
  undefined8 local_250;
  ResultCollector result;
  undefined1 local_1f8 [384];
  char buffer [64];
  
  bVar5 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar5) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x79e);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8," // ERROR: ",(allocator<char> *)buffer);
  tcu::ResultCollector::ResultCollector(&result,pTVar2,(string *)local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  outlen = -1;
  local_250 = (**(code **)(lVar8 + 0x640))(0x9117,0);
  iVar6 = (**(code **)(lVar8 + 0x800))();
  if (iVar6 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"Got Error ",(allocator<char> *)&section);
    local_2f8 = glu::getErrorName;
    local_2f0 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
    std::operator+(&local_2b0,&local_2e0,&local_270);
    std::operator+(&local_290,&local_2b0,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_290,"fenceSync");
    tcu::ResultCollector::fail(&result,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  local_2e4 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
  iVar6 = (**(code **)(lVar8 + 0x800))();
  if (iVar6 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"Got Error ",(allocator<char> *)&section);
    local_2f8 = glu::getErrorName;
    local_2f0 = iVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
    std::operator+(&local_2b0,&local_2e0,&local_270);
    std::operator+(&local_290,&local_2b0,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_290,"createShader");
    tcu::ResultCollector::fail(&result,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8,"Shader",(allocator<char> *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"Shader object",(allocator<char> *)&local_2e0);
  local_300 = this;
  local_2c0 = lVar8;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_1f8,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)local_1f8);
  poVar1 = (ostringstream *)(local_1f8 + 8);
  for (lVar8 = 0; poVar10 = (ostringstream *)(local_1f8 + 8), lVar8 != 0x30; lVar8 = lVar8 + 0x10) {
    local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar10);
    std::operator<<((ostream *)poVar10,"Setting label to string: \"");
    std::operator<<((ostream *)poVar10,"This is a debug label");
    std::operator<<((ostream *)poVar10,"\"");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar10);
    lVar4 = local_2c0;
    (**(code **)(local_2c0 + 0xfc0))(0x82e1,local_2e4,0xfffffffffffffffe,"This is a debug label");
    iVar6 = (**(code **)(lVar4 + 0x800))();
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"Got Error ",&local_305);
      local_2f8 = glu::getErrorName;
      local_2f0 = iVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
      std::operator+(&local_2b0,&local_2e0,&local_270);
      std::operator+(&local_290,&local_2b0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"objectLabel");
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Clearing label ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1f8,
                        (char **)((long)&iterate::s_clearMethods[0].description + lVar8));
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    lVar4 = local_2c0;
    (**(code **)(local_2c0 + 0xfc0))
              (0x82e1,local_2e4,*(undefined4 *)((long)&iterate::s_clearMethods[0].length + lVar8),0)
    ;
    iVar6 = (**(code **)(lVar4 + 0x800))();
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"Got Error ",&local_305);
      local_2f8 = glu::getErrorName;
      local_2f0 = iVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
      std::operator+(&local_2b0,&local_2e0,&local_270);
      std::operator+(&local_290,&local_2b0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"objectLabel");
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 8));
    std::operator<<((ostream *)(local_1f8 + 8),"Querying label");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f8 + 8));
    lVar4 = local_2c0;
    buffer[0] = 'X';
    outlen = -1;
    (**(code **)(local_2c0 + 0x958))(0x82e1,local_2e4,0x40,&outlen,buffer);
    iVar6 = (**(code **)(lVar4 + 0x800))();
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"Got Error ",&local_305);
      local_2f8 = glu::getErrorName;
      local_2f0 = iVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
      std::operator+(&local_2b0,&local_2e0,&local_270);
      std::operator+(&local_290,&local_2b0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"getObjectLabel");
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    if (outlen == 0) {
      if (buffer[0] != '\0') {
        psVar9 = (string *)local_1f8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar9,"label was not null terminated",(allocator<char> *)&local_290);
        tcu::ResultCollector::fail(&result,psVar9);
        goto LAB_011cf66f;
      }
      local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 8));
      std::operator<<((ostream *)(local_1f8 + 8),"Got 0-sized null-terminated string.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f8 + 8));
    }
    else {
      de::toString<int>(&local_290,&outlen);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "\'length\' was not zero, got ",&local_290);
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      psVar9 = &local_290;
LAB_011cf66f:
      std::__cxx11::string::~string((string *)psVar9);
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar2 = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1f8,"Sync",(allocator<char> *)&local_2b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"Sync object",(allocator<char> *)&local_2e0);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_1f8,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)local_1f8);
  poVar1 = (ostringstream *)(local_1f8 + 8);
  poVar10 = (ostringstream *)(local_1f8 + 8);
  lVar8 = 0;
  do {
    this_01 = (ostringstream *)(local_1f8 + 8);
    if (lVar8 == 0x30) {
      tcu::ScopedLogSection::~ScopedLogSection(&section);
      lVar8 = local_2c0;
      (**(code **)(local_2c0 + 0x470))(local_2e4);
      pCVar3 = local_300;
      (**(code **)(lVar8 + 0x478))(local_250);
      tcu::ResultCollector::setTestContextResult
                (&result,(pCVar3->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ResultCollector::~ResultCollector(&result);
      return STOP;
    }
    local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::operator<<((ostream *)this_01,"Setting label to string: \"");
    std::operator<<((ostream *)this_01,"This is a debug label");
    std::operator<<((ostream *)this_01,"\"");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    lVar4 = local_2c0;
    (**(code **)(local_2c0 + 0xfc8))(local_250,0xfffffffffffffffe,"This is a debug label");
    iVar6 = (**(code **)(lVar4 + 0x800))();
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"Got Error ",&local_305);
      local_2f8 = glu::getErrorName;
      local_2f0 = iVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
      std::operator+(&local_2b0,&local_2e0,&local_270);
      std::operator+(&local_290,&local_2b0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"objectPtrLabel");
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Clearing label ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1f8,
                        (char **)((long)&iterate::s_clearMethods[0].description + lVar8));
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    lVar4 = local_2c0;
    (**(code **)(local_2c0 + 0xfc8))
              (local_250,*(undefined4 *)((long)&iterate::s_clearMethods[0].length + lVar8),0);
    iVar6 = (**(code **)(lVar4 + 0x800))();
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"Got Error ",&local_305);
      local_2f8 = glu::getErrorName;
      local_2f0 = iVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
      std::operator+(&local_2b0,&local_2e0,&local_270);
      std::operator+(&local_290,&local_2b0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"objectPtrLabel");
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar10);
    std::operator<<((ostream *)poVar10,"Querying label");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar10);
    lVar4 = local_2c0;
    buffer[0] = 'X';
    outlen = -1;
    (**(code **)(local_2c0 + 0x960))(local_250,0x40,&outlen,buffer);
    iVar6 = (**(code **)(lVar4 + 0x800))();
    if (iVar6 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"Got Error ",&local_305);
      local_2f8 = glu::getErrorName;
      local_2f0 = iVar6;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_270,&local_2f8);
      std::operator+(&local_2b0,&local_2e0,&local_270);
      std::operator+(&local_290,&local_2b0,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     &local_290,"getObjectPtrLabel");
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_2e0);
    }
    if (outlen == 0) {
      if (buffer[0] != '\0') {
        psVar9 = (string *)local_1f8;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar9,"label was not null terminated",(allocator<char> *)&local_290);
        tcu::ResultCollector::fail(&result,psVar9);
        goto LAB_011cfbeb;
      }
      local_1f8._0_8_ = ((local_300->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log
      ;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1f8 + 8));
      std::operator<<((ostream *)(local_1f8 + 8),"Got 0-sized null-terminated string.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1f8 + 8));
    }
    else {
      de::toString<int>(&local_290,&outlen);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                     "\'length\' was not zero, got ",&local_290);
      tcu::ResultCollector::fail
                (&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      psVar9 = &local_290;
LAB_011cfbeb:
      std::__cxx11::string::~string((string *)psVar9);
    }
    lVar8 = lVar8 + 0x10;
  } while( true );
}

Assistant:

ClearLabelCase::IterateResult ClearLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	static const struct
	{
		const char*	description;
		int			length;
	} s_clearMethods[] =
	{
		{ " with NULL label and 0 length",			0	},
		{ " with NULL label and 1 length",			1	},
		{ " with NULL label and negative length",	-1	},
	};

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	GLuint					shader;
	glw::GLsync				sync;
	char					buffer[64];

	sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "fenceSync");

	shader = gl.createShader(GL_FRAGMENT_SHADER);
	GLS_COLLECT_GL_ERROR(result, gl.getError(), "createShader");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Shader", "Shader object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, -2,  msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectLabel(GL_SHADER, shader, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectLabel(GL_SHADER, shader, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Sync", "Sync object");

		for (int methodNdx = 0; methodNdx < DE_LENGTH_OF_ARRAY(s_clearMethods); ++methodNdx)
		{
			m_testCtx.getLog() << TestLog::Message << "Setting label to string: \"" << msg << "\"" << TestLog::EndMessage;
			gl.objectPtrLabel(sync, -2, msg);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Clearing label " << s_clearMethods[methodNdx].description << TestLog::EndMessage;
			gl.objectPtrLabel(sync, s_clearMethods[methodNdx].length, DE_NULL);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "objectPtrLabel");

			m_testCtx.getLog() << TestLog::Message << "Querying label" << TestLog::EndMessage;
			buffer[0] = 'X';
			outlen = -1;
			gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);
			GLS_COLLECT_GL_ERROR(result, gl.getError(), "getObjectPtrLabel");

			if (outlen != 0)
				result.fail("'length' was not zero, got " + de::toString(outlen));
			else if (buffer[0] != '\0')
				result.fail("label was not null terminated");
			else
				m_testCtx.getLog() << TestLog::Message << "Got 0-sized null-terminated string." << TestLog::EndMessage;
		}
	}

	gl.deleteShader(shader);
	gl.deleteSync(sync);

	result.setTestContextResult(m_testCtx);
	return STOP;
}